

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QVariant>::emplace<QVariant>
          (QMovableArrayOps<QVariant> *this,qsizetype i,QVariant *args)

{
  QVariant **ppQVar1;
  qsizetype *pqVar2;
  undefined8 *puVar3;
  Data *pDVar4;
  long lVar5;
  QVariant *pQVar6;
  PrivateShared *pPVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long in_FS_OFFSET;
  bool bVar10;
  Inserter local_70;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_00128d0b:
    local_48.shared = (args->d).data.shared;
    local_48._8_8_ = *(undefined8 *)((long)&(args->d).data + 8);
    local_48._16_8_ = *(undefined8 *)((long)&(args->d).data + 0x10);
    uStack_30 = *(undefined8 *)&(args->d).field_0x18;
    (args->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(args->d).data + 8) = 0;
    *(undefined8 *)((long)&(args->d).data + 0x10) = 0;
    *(undefined8 *)&(args->d).field_0x18 = 2;
    bVar10 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size != 0;
    QArrayDataPointer<QVariant>::detachAndGrow
              ((QArrayDataPointer<QVariant> *)this,(uint)(i == 0 && bVar10),1,(QVariant **)0x0,
               (QArrayDataPointer<QVariant> *)0x0);
    if (i == 0 && bVar10) {
      pQVar6 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr;
      *(undefined8 *)((long)&pQVar6[-1].d.data + 0x10) = local_48._16_8_;
      *(undefined8 *)&pQVar6[-1].d.field_0x18 = uStack_30;
      pQVar6[-1].d.data.shared = local_48.shared;
      *(undefined8 *)((long)&pQVar6[-1].d.data + 8) = local_48._8_8_;
      local_48.shared = (PrivateShared *)0x0;
      local_48._8_8_ = 0;
      local_48._16_8_ = 0;
      uStack_30 = 2;
      ppQVar1 = &(this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      local_70.displaceTo =
           (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr;
      local_70.displaceFrom = local_70.displaceTo + i;
      local_70.displaceTo = local_70.displaceTo + i + 1;
      local_70.nInserts = 1;
      local_70.bytes =
           ((this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size - i) *
           0x20;
      local_70.data = (QArrayDataPointer<QVariant> *)this;
      memmove(local_70.displaceTo,local_70.displaceFrom,local_70.bytes);
      *(undefined8 *)((long)&((local_70.displaceFrom)->d).data + 0x10) = local_48._16_8_;
      *(undefined8 *)&((local_70.displaceFrom)->d).field_0x18 = uStack_30;
      ((local_70.displaceFrom)->d).data.shared = local_48.shared;
      *(undefined8 *)((long)&((local_70.displaceFrom)->d).data + 8) = local_48._8_8_;
      local_48.shared = (PrivateShared *)0x0;
      local_48._8_8_ = 0;
      local_48._16_8_ = 0;
      uStack_30 = 2;
      local_70.displaceFrom = local_70.displaceFrom + 1;
      Inserter::~Inserter(&local_70);
    }
    QVariant::~QVariant((QVariant *)&local_48);
  }
  else {
    lVar5 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size;
    if ((lVar5 == i && pDVar4 != (Data *)0x0) &&
       ((pDVar4->super_QArrayData).alloc !=
        ((long)((long)(this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr
               - ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 5)
        + lVar5)) {
      pQVar6 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr;
      pPVar7 = (args->d).data.shared;
      uVar8 = *(undefined8 *)((long)&(args->d).data + 8);
      uVar9 = *(undefined8 *)&(args->d).field_0x18;
      puVar3 = (undefined8 *)((long)&pQVar6[lVar5].d.data + 0x10);
      *puVar3 = *(undefined8 *)((long)&(args->d).data + 0x10);
      puVar3[1] = uVar9;
      pQVar6 = pQVar6 + lVar5;
      (pQVar6->d).data.shared = pPVar7;
      *(undefined8 *)((long)&(pQVar6->d).data + 8) = uVar8;
      (args->d).data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(args->d).data + 8) = 0;
      *(undefined8 *)((long)&(args->d).data + 0x10) = 0;
      *(undefined8 *)&(args->d).field_0x18 = 2;
    }
    else {
      if (((i != 0) || (pDVar4 == (Data *)0x0)) ||
         ((QVariant *)((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
          == (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr))
      goto LAB_00128d0b;
      pQVar6 = (this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr;
      pPVar7 = (args->d).data.shared;
      uVar8 = *(undefined8 *)((long)&(args->d).data + 8);
      uVar9 = *(undefined8 *)&(args->d).field_0x18;
      *(undefined8 *)((long)&pQVar6[-1].d.data + 0x10) =
           *(undefined8 *)((long)&(args->d).data + 0x10);
      *(undefined8 *)&pQVar6[-1].d.field_0x18 = uVar9;
      pQVar6[-1].d.data.shared = pPVar7;
      *(undefined8 *)((long)&pQVar6[-1].d.data + 8) = uVar8;
      (args->d).data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(args->d).data + 8) = 0;
      *(undefined8 *)((long)&(args->d).data + 0x10) = 0;
      *(undefined8 *)&(args->d).field_0x18 = 2;
      ppQVar1 = &(this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QVariant>).super_QArrayDataPointer<QVariant>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }